

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall date_parse_result::def_date(date_parse_result *this,int32_t dayno)

{
  multicaldate_t *pmVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  int *piVar5;
  int *piVar6;
  
  (*this->cal->_vptr_multicaldate_t[3])(this->cal,CONCAT44(in_register_00000034,dayno));
  iVar2 = this->era;
  iVar4 = this->yy;
  if (iVar2 != 0) {
    iVar3 = -iVar4;
    if (iVar2 != -2) {
      if (iVar2 == -1) {
        this->yy = iVar3;
      }
      else {
        iVar3 = iVar4;
        if (iVar2 == 2) {
          this->yy_needs_century = 0;
        }
      }
      pmVar1 = this->cal;
      iVar4 = iVar3;
      goto LAB_0024e4b9;
    }
    iVar4 = 1 - iVar4;
    this->yy = iVar4;
    this->yy_needs_century = 0;
  }
  pmVar1 = this->cal;
LAB_0024e4b9:
  piVar6 = &pmVar1->y_;
  piVar5 = &this->yy;
  if (this->yy_needs_century != 0) {
    iVar4 = (*piVar6 - *piVar6 % 100) + iVar4;
    *piVar5 = iVar4;
    iVar2 = *piVar6;
    if (iVar4 < iVar2 + -0x32) {
      iVar4 = iVar4 + 100;
      *piVar5 = iVar4;
      iVar2 = *piVar6;
    }
    if (iVar2 + 0x31 < iVar4) {
      *piVar5 = iVar4 + -100;
    }
  }
  return;
}

Assistant:

void def_date(int32_t dayno)
    {
        /* convert the day number to a calendar date */
        cal->set_dayno(dayno);

        /* apply the era to the year, if both are present */
        if (era != 0 && has_year())
        {
            switch (era)
            {
            case 1:
                /* 
                 *   astronomical '+' notation - the internal year number
                 *   matches the nominal year 
                 */
                break;
                
            case 2:
                /* 
                 *   AD - the internal year matches the nominal year, but an
                 *   explicit AD overrides the need for a century; e.g., AD
                 *   87 is pretty clear that we're talking about an
                 *   historical date in the first century 
                 */
                yy_needs_century = FALSE;
                break;
                
            case -1:
                /* 
                 *   astronomical '-' notation - the internal year number
                 *   matches the nominal negative year number, since we use
                 *   the same notation internally
                 */
                yy = -yy;
                break;
                
            case -2:
                /* BC - 1 BC is internal year 0, 2 BC is year -1, etc */
                yy = -yy + 1;
                yy_needs_century = FALSE;
                break;
            }
        }

        /* set the default year, month, and day from the given date */
        def_year(cal->y());
        def_month(cal->m());
        def_day(cal->d());

        /* 
         *   If the year was specified without a century, choose the century
         *   such that it yields the year nearest to the current year.  This
         *   is equivalent to finding the year within 50 years of the current
         *   year.  For 2012, this makes the range 1962 to 2061 - so '62 is
         *   taken to be 1962, '85 is 1985, but '15 is 2015, and 61 is 2061.
         */
        if (yy_needs_century)
        {
            yy += ((cal->y() / 100) * 100);
            if (yy < cal->y() - 50)
                yy += 100;
            if (yy > cal->y() + 49)
                yy -= 100;
        }
    }